

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O3

void (anonymous_namespace)::
     run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (Covec<float> *cv,
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               beg,__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   end,size_t batch_size,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *gen)

{
  size_t sVar1;
  pointer psVar2;
  pointer psVar3;
  ulong uVar4;
  ulong uVar5;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  beg_00;
  ulong uVar6;
  vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  grads;
  allocator_type local_b3;
  allocator_type local_b2;
  allocator_type local_b1;
  size_t local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_88;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_80;
  vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  local_68;
  value_type local_50;
  
  sVar1 = cv->neg_size_;
  psVar2 = (cv->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (cv->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = batch_size;
  local_88 = gen;
  std::vector<float,_std::allocator<float>_>::vector(&local_a8,cv->dim_,&local_b1);
  local_50.first = 0;
  local_50.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_50.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::vector(&local_80,(long)psVar3 - (long)psVar2 >> 4,&local_50,&local_b2);
  std::
  vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::vector(&local_68,(sVar1 + 1) * local_b0,&local_80,&local_b3);
  std::
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~vector(&local_80);
  if (local_50.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  sVar1 = local_b0;
  uVar6 = ((long)end._M_current - (long)beg._M_current >> 3) * -0x5555555555555555;
  uVar5 = 0;
  beg_00._M_current = beg._M_current;
  while (uVar5 < uVar6) {
    uVar5 = uVar5 + local_b0;
    uVar4 = uVar5;
    if (uVar6 < uVar5) {
      uVar4 = uVar6;
    }
    covec::Covec<float>::
    update_batch_thread<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>*,std::vector<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>,std::allocator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (cv,beg_00,beg._M_current + uVar4,
               (__normal_iterator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>_>
                )local_68.
                 super__Vector_base<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_88);
    beg_00._M_current = beg_00._M_current + sVar1;
  }
  std::
  vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void run_thread(Covec<Real>& cv, InputIterator beg, InputIterator end,
                    const std::size_t batch_size,
                    RandomGenerator& gen)
  {
    std::size_t M = static_cast<std::size_t>(std::distance(beg, end));
    
    typedef std::pair<std::size_t, std::vector<Real> > j_grad;
    std::vector< std::vector< j_grad > >
      grads(batch_size * (1 + cv.neg_size()),
    	    std::vector< j_grad >( cv.order(),
                                   j_grad( 0, std::vector<Real>(cv.dimension()) )
                                   )
    	    ); // data_idx -> order -> entry -> dim -> value
    
    assert( grads[0].size() == cv.order() );
    for(std::size_t m = 0; m < M; m += batch_size){
      auto cur_beg = beg + m;
      auto cur_end = beg + std::min( m + batch_size, M );
      cv.update_batch_thread(cur_beg, cur_end, grads.begin(), gen);
    }
  }